

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcollator.cpp
# Opt level: O0

void __thiscall QCollator::QCollator(QCollator *this,QLocale *locale)

{
  void *pvVar1;
  QCollatorPrivate *in_RDI;
  QLocale *in_stack_ffffffffffffffc8;
  
  pvVar1 = operator_new(0x20);
  QCollatorPrivate::QCollatorPrivate(in_RDI,in_stack_ffffffffffffffc8);
  *(void **)in_RDI = pvVar1;
  return;
}

Assistant:

QCollator::QCollator(const QLocale &locale)
    : d(new QCollatorPrivate(locale))
{
}